

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# structured_bindings.cpp
# Opt level: O0

void printVector<unsigned_long>(vector<unsigned_long,_std::allocator<unsigned_long>_> *vector)

{
  bool bVar1;
  reference puVar2;
  ostream *poVar3;
  unsigned_long *elem;
  const_iterator __end0;
  const_iterator __begin0;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *__range1;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *vector_local;
  
  std::operator<<((ostream *)&std::cout,"[ ");
  __end0 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin(vector);
  elem = (unsigned_long *)std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end(vector);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end0,(__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                *)&elem);
    if (!bVar1) break;
    puVar2 = __gnu_cxx::
             __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
             ::operator*(&__end0);
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,*puVar2);
    std::operator<<(poVar3," ");
    __gnu_cxx::
    __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
    ::operator++(&__end0);
  }
  std::operator<<((ostream *)&std::cout,"]");
  return;
}

Assistant:

void printVector(const std::vector<T>& vector)
{
    std::cout << "[ ";
    for (const auto& elem: vector)
    {
        std::cout << elem << " ";
    }
    std::cout << "]";
}